

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

bool __thiscall graph::isEdge(graph *this,restaurant *from,restaurant *to)

{
  unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *__x;
  ulong uVar6;
  int i;
  ulong uVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adj;
  restaurant *local_50;
  restaurant *local_48;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_40;
  
  this_00 = &this->mapper;
  local_50 = to;
  local_48 = from;
  pmVar4 = std::__detail::
           _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_48);
  iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->v)._M_t,pmVar4);
  p_Var1 = &(this->v)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    pmVar4 = std::__detail::
             _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_50);
    iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&(this->v)._M_t,pmVar4);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      pmVar4 = std::__detail::
               _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
      __x = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,pmVar4);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_40,__x
                );
      uVar7 = 0;
      do {
        uVar6 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                (long)local_40._M_impl.super__Vector_impl_data._M_start >> 3;
        bVar3 = uVar7 < uVar6;
        if (uVar6 <= uVar7) break;
        iVar2 = local_40._M_impl.super__Vector_impl_data._M_start[uVar7].first;
        pmVar4 = std::__detail::
                 _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,&local_50);
        uVar7 = uVar7 + 1;
      } while (iVar2 != *pmVar4);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_40);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool graph::isEdge(restaurant *from, restaurant *to)
{
    if (v.find(mapper[from]) == v.end() || v.find(mapper[to]) == v.end())
    {
        return false;
    }
    vector<pair<int, int>> adj = theGraph[mapper[from]];
    for (int i = 0; i < adj.size(); i++)
    {
        if (adj[i].first == mapper[to])
        {
            return true;
        }
    }
    return false;
}